

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

void rw::wdgl::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  AttribDesc *a_00;
  Geometry *this;
  InstanceDataHeader *pIVar1;
  uint32 uVar2;
  int local_90;
  int local_8c;
  int32 i_4;
  int32 i_3;
  int32 i_2;
  int32 i_1;
  AttribDesc *a;
  int i;
  InstanceDataHeader *header;
  float32 f [4];
  V3d *local_50;
  V3d *norm;
  V3d *vert;
  RGBA *color;
  TexCoords *texcoord;
  uint8 *p;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    uVar2 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar2;
    Geometry::allocateData(this);
    color = (RGBA *)this->texCoords[0];
    vert = (V3d *)this->colors;
    norm = this->morphTargets->vertices;
    local_50 = this->morphTargets->normals;
    pIVar1 = this->instData;
    for (a._4_4_ = 0; a._4_4_ < (int)pIVar1[1].platform; a._4_4_ = a._4_4_ + 1) {
      a_00 = (AttribDesc *)(*(long *)(pIVar1 + 2) + (long)a._4_4_ * 0x18);
      texcoord = (TexCoords *)(*(long *)(pIVar1 + 6) + (ulong)a_00->offset);
      switch(a_00->index) {
      case 0:
        for (i_3 = 0; i_3 < this->numVertices; i_3 = i_3 + 1) {
          atomic = (Atomic *)texcoord;
          unpackattrib((float *)norm,(uint8 *)texcoord,a_00,1.0);
          norm = norm + 1;
          texcoord = (TexCoords *)((long)&texcoord->u + (ulong)a_00->stride);
        }
        break;
      case 1:
        for (i_4 = 0; i_4 < this->numVertices; i_4 = i_4 + 1) {
          atomic = (Atomic *)texcoord;
          unpackattrib((float *)color,(uint8 *)texcoord,a_00,512.0);
          color = color + 2;
          texcoord = (TexCoords *)((long)&texcoord->u + (ulong)a_00->stride);
        }
        break;
      case 2:
        for (local_8c = 0; local_8c < this->numVertices; local_8c = local_8c + 1) {
          atomic = (Atomic *)texcoord;
          unpackattrib((float *)local_50,(uint8 *)texcoord,a_00,1.0);
          local_50 = local_50 + 1;
          texcoord = (TexCoords *)((long)&texcoord->u + (ulong)a_00->stride);
        }
        break;
      case 3:
        for (local_90 = 0; local_90 < this->numVertices; local_90 = local_90 + 1) {
          atomic = (Atomic *)texcoord;
          unpackattrib((float *)&header,(uint8 *)texcoord,a_00,1.0);
          *(char *)&vert->x = (char)(int)(header._0_4_ * 255.0);
          *(char *)((long)&vert->x + 1) = (char)(int)(header._4_4_ * 255.0);
          *(char *)((long)&vert->x + 2) = (char)(int)((float)f[0] * 255.0);
          *(char *)((long)&vert->x + 3) = (char)(int)((float)f[1] * 255.0);
          vert = (V3d *)&vert->y;
          texcoord = (TexCoords *)((long)&texcoord->u + (ulong)a_00->stride);
        }
      }
    }
    if (rwpipe[1].impl.instance != (_func_void_ObjPipeline_ptr_Atomic_ptr *)0x0) {
      (*rwpipe[1].impl.instance)((ObjPipeline *)this,atomic);
    }
    Geometry::generateTriangles(this,(int8 *)0x0);
    this->flags = this->flags & 0xfeffffff;
    destroyNativeData(this,0,0);
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_WDGL);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();

	uint8 *p;
	TexCoords *texcoord = geo->texCoords[0];
	RGBA *color = geo->colors;
	V3d *vert = geo->morphTargets->vertices;
	V3d *norm = geo->morphTargets->normals;
	float32 f[4];

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	for(int i = 0; i < header->numAttribs; i++){
		AttribDesc *a = &header->attribs[i];
		p = header->data + a->offset;

		switch(a->index){
		case 0:		// Vertices
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)vert, p, a);
				vert++;
				p += a->stride;
			}
			break;

		case 1:		// texCoords
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)texcoord, p, a, 512.0f);
				texcoord++;
				p += a->stride;
			}
			break;

		case 2:		// normals
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)norm, p, a);
				norm++;
				p += a->stride;
			}
			break;

		case 3:		// colors
			for(int32 i = 0; i < geo->numVertices; i++){
				// TODO: this seems too complicated
				unpackattrib(f, p, a);
				color->red   = f[0]*255.0f;
				color->green = f[1]*255.0f;
				color->blue  = f[2]*255.0f;
				color->alpha = f[3]*255.0f;
				color++;
				p += a->stride;
			}
			break;
		}
	}

	if(pipe->uninstanceCB)
		pipe->uninstanceCB(geo);

	geo->generateTriangles();

	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}